

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O2

RGBFilm * pbrt::RGBFilm::Create
                    (ParameterDictionary *parameters,Float exposureTime,FilterHandle *filter,
                    RGBColorSpace *colorSpace,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  PixelSensor *sensor;
  RGBFilm *pRVar2;
  bool writeFP16;
  allocator<char> local_a5;
  Float local_a4;
  Float local_a0;
  Float maxComponentValue;
  RGBColorSpace *colorSpace_local;
  Allocator alloc_local;
  FilmBaseParameters filmBaseParameters;
  TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
  local_38;
  
  local_a4 = exposureTime;
  colorSpace_local = colorSpace;
  alloc_local = alloc;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filmBaseParameters,"maxcomponentvalue",(allocator<char> *)&writeFP16);
  local_a0 = ParameterDictionary::GetOneFloat(parameters,(string *)&filmBaseParameters,INFINITY);
  std::__cxx11::string::~string((string *)&filmBaseParameters);
  maxComponentValue = local_a0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filmBaseParameters,"savefp16",&local_a5);
  bVar1 = ParameterDictionary::GetOneBool(parameters,(string *)&filmBaseParameters,true);
  std::__cxx11::string::~string((string *)&filmBaseParameters);
  writeFP16 = bVar1;
  sensor = PixelSensor::Create(parameters,colorSpace,local_a4,loc,alloc);
  local_38.bits =
       (filter->
       super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
       ).bits;
  FilmBaseParameters::FilmBaseParameters
            (&filmBaseParameters,parameters,(FilterHandle *)&local_38,sensor,loc);
  pRVar2 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::RGBFilm,pbrt::FilmBaseParameters&,pbrt::RGBColorSpace_const*&,float&,bool&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     (&alloc_local,&filmBaseParameters,&colorSpace_local,&maxComponentValue,
                      &writeFP16,&alloc_local);
  std::__cxx11::string::~string((string *)&filmBaseParameters.filename);
  return pRVar2;
}

Assistant:

RGBFilm *RGBFilm::Create(const ParameterDictionary &parameters, Float exposureTime,
                         FilterHandle filter, const RGBColorSpace *colorSpace,
                         const FileLoc *loc, Allocator alloc) {
    Float maxComponentValue = parameters.GetOneFloat("maxcomponentvalue", Infinity);
    bool writeFP16 = parameters.GetOneBool("savefp16", true);

    PixelSensor *sensor =
        PixelSensor::Create(parameters, colorSpace, exposureTime, loc, alloc);
    FilmBaseParameters filmBaseParameters(parameters, filter, sensor, loc);

    return alloc.new_object<RGBFilm>(filmBaseParameters, colorSpace, maxComponentValue,
                                     writeFP16, alloc);
}